

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall CLI::App::get_option_no_throw(App *this,string *option_name)

{
  pointer puVar1;
  pointer pcVar2;
  pointer psVar3;
  App *this_00;
  bool bVar4;
  Option *pOVar5;
  shared_ptr<CLI::App> *subc;
  pointer puVar6;
  pointer psVar7;
  bool bVar8;
  Option *local_80;
  string local_70;
  string local_50;
  
  puVar6 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = puVar6 == puVar1;
  if (!bVar8) {
    do {
      pOVar5 = (puVar6->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
               _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar2 = (option_name->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + option_name->_M_string_length);
      bVar4 = Option::check_name(pOVar5,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        local_80 = (puVar6->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        break;
      }
      puVar6 = puVar6 + 1;
      bVar8 = puVar6 == puVar1;
    } while (!bVar8);
  }
  if (bVar8) {
    psVar7 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar7 != psVar3) {
      do {
        this_00 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar8 = true;
        if ((this_00->name_)._M_string_length == 0) {
          pcVar2 = (option_name->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + option_name->_M_string_length);
          pOVar5 = get_option_no_throw(this_00,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          bVar8 = pOVar5 == (Option *)0x0;
          if (!bVar8) {
            local_80 = pOVar5;
          }
        }
        if (!bVar8) {
          return local_80;
        }
        psVar7 = psVar7 + 1;
      } while (psVar7 != psVar3);
    }
    local_80 = (Option *)0x0;
  }
  return local_80;
}

Assistant:

Option *get_option_no_throw(std::string option_name) noexcept {
        for(Option_p &opt : options_) {
            if(opt->check_name(option_name)) {
                return opt.get();
            }
        }
        for(auto &subc : subcommands_) {
            // also check down into nameless subcommands
            if(subc->get_name().empty()) {
                auto opt = subc->get_option_no_throw(option_name);
                if(opt != nullptr) {
                    return opt;
                }
            }
        }
        return nullptr;
    }